

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Metadata::SharedDtor(Metadata *this)

{
  ulong uVar1;
  LogMessage *other;
  undefined8 *puVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/Model.pb.cc"
               ,0x487);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((undefined8 *)(this->shortdescription_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->shortdescription_);
  }
  if ((undefined8 *)(this->versionstring_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->versionstring_);
  }
  if ((undefined8 *)(this->author_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->author_);
  }
  if ((undefined8 *)(this->license_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->license_);
  }
  return;
}

Assistant:

inline void Metadata::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  shortdescription_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  versionstring_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  author_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  license_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}